

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O2

void test_bson_as_json_double(void)

{
  char cVar1;
  int iVar2;
  undefined8 uVar3;
  char *pcVar4;
  char *__s2;
  size_t len;
  
  uVar3 = bson_new();
  cVar1 = bson_append_double(0x405ee00000000000,uVar3,"foo",0xffffffffffffffff);
  if (cVar1 == '\0') {
    pcVar4 = "bson_append_double (b, \"foo\", -1, 123.5)";
    uVar3 = 0x177;
  }
  else {
    cVar1 = bson_append_double(0x4008000000000000,uVar3,"bar",0xffffffffffffffff);
    if (cVar1 == '\0') {
      pcVar4 = "bson_append_double (b, \"bar\", -1, 3)";
      uVar3 = 0x178;
    }
    else {
      cVar1 = bson_append_double(0xbff0000000000000,uVar3,"baz",0xffffffffffffffff);
      if (cVar1 == '\0') {
        pcVar4 = "bson_append_double (b, \"baz\", -1, -1)";
        uVar3 = 0x179;
      }
      else {
        cVar1 = bson_append_double(0x3fa0000000000000,uVar3,"quux",0xffffffffffffffff);
        if (cVar1 == '\0') {
          pcVar4 = "bson_append_double (b, \"quux\", -1, 0.03125)";
          uVar3 = 0x17a;
        }
        else {
          cVar1 = bson_append_double(0x547d42aea2879f2e,uVar3,"huge",0xffffffffffffffff);
          if (cVar1 != '\0') {
            pcVar4 = (char *)bson_as_json(uVar3,&len);
            __s2 = (char *)bson_strdup_printf(0x547d42aea2879f2e,
                                              "{ \"foo\" : 123.5, \"bar\" : 3.0, \"baz\" : -1.0, \"quux\" : 0.03125, \"huge\" : %.20g }"
                                             );
            if (pcVar4 != __s2) {
              iVar2 = strcmp(pcVar4,__s2);
              if (iVar2 != 0) {
                fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" != \"%s\"\n",pcVar4,__s2);
                abort();
              }
            }
            bson_free(__s2);
            bson_free(pcVar4);
            bson_destroy(uVar3);
            return;
          }
          pcVar4 = "bson_append_double (b, \"huge\", -1, 1e99)";
          uVar3 = 0x17b;
        }
      }
    }
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
          uVar3,"test_bson_as_json_double",pcVar4);
  abort();
}

Assistant:

static void
test_bson_as_json_double (void)
{
   size_t len;
   bson_t *b;
   char *str;
   char *expected;

   b = bson_new ();
   BSON_ASSERT (bson_append_double (b, "foo", -1, 123.5));
   BSON_ASSERT (bson_append_double (b, "bar", -1, 3));
   BSON_ASSERT (bson_append_double (b, "baz", -1, -1));
   BSON_ASSERT (bson_append_double (b, "quux", -1, 0.03125));
   BSON_ASSERT (bson_append_double (b, "huge", -1, 1e99));
   str = bson_as_json (b, &len);

   expected = bson_strdup_printf ("{"
                                  " \"foo\" : 123.5,"
                                  " \"bar\" : 3.0,"
                                  " \"baz\" : -1.0,"
                                  " \"quux\" : 0.03125,"
                                  " \"huge\" : %.20g }",
                                  1e99);

   ASSERT_CMPSTR (str, expected);

   bson_free (expected);
   bson_free (str);
   bson_destroy (b);
}